

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

bool_t NodeFindDef(node *p,tchar_t *Token,datadef *DataDef)

{
  int iVar1;
  fourcc_t fVar2;
  dataid Id;
  bool_t bVar3;
  tchar_t *ptVar4;
  
  if (*Token == '_') {
    ptVar4 = Token + 1;
    do {
      if (*ptVar4 == '\0') {
        iVar1 = StringToInt(Token + 1,1);
        Id = (dataid)iVar1;
        goto LAB_00115f25;
      }
      iVar1 = Hex((int)*ptVar4);
      ptVar4 = ptVar4 + 1;
    } while (-1 < iVar1);
  }
  if (p == (node *)0x0) {
    __assert_fail("(const void*)(p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                  ,0x422,"bool_t NodeFindDef(node *, const tchar_t *, datadef *)");
  }
  Id = (**(code **)((long)p->VMT + 0x38))(p,Token);
  if (Id == 0) {
    fVar2 = StringToFourCC(Token,0);
    Id = (dataid)fVar2;
  }
LAB_00115f25:
  bVar3 = NodeDataDef(p,Id,DataDef);
  return bVar3;
}

Assistant:

bool_t NodeFindDef(node* p,const tchar_t* Token,datadef* DataDef)
{
    dataid Id;
    if (Token[0]=='_' && CheckHex(Token+1))
        Id = StringToInt(Token+1,1);
    else
    {
        Id = Node_FindParam(p,Token);
        if (!Id)
            Id = StringToFourCC(Token,0);
    }
    return NodeDataDef(p,Id,DataDef);
}